

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::BatchedMatMulLayerParams::MergePartialFromCodedStream
          (BatchedMatMulLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int length;
  uint32 uVar4;
  int byte_limit;
  WeightParams *this_00;
  unsigned_long uVar5;
  uint8 *puVar6;
  pair<int,_int> pVar7;
  char cVar8;
  ulong uVar9;
  pair<unsigned_long,_bool> pVar10;
  
LAB_0021f4c6:
  pbVar2 = input->buffer_;
  uVar4 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar4 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_0021f4e9;
    input->buffer_ = pbVar2 + 1;
    uVar9 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_0021f4e9:
    uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
    uVar9 = 0;
    if (uVar4 - 1 < 0x7f) {
      uVar9 = 0x100000000;
    }
    uVar9 = uVar4 | uVar9;
  }
  uVar4 = (uint32)uVar9;
  if ((uVar9 & 0x100000000) == 0) goto switchD_0021f547_caseD_3;
  cVar8 = (char)uVar9;
  switch((uint)(uVar9 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar8 == '\b') {
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (uVar5 = (unsigned_long)(char)*puVar6, -1 < (long)uVar5))
      {
        input->buffer_ = puVar6 + 1;
      }
      else {
        pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar5 = pVar10.first;
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->transposea_ = uVar5 != 0;
      goto LAB_0021f4c6;
    }
    break;
  case 2:
    if (cVar8 == '\x10') {
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (uVar5 = (unsigned_long)(char)*puVar6, -1 < (long)uVar5))
      {
        input->buffer_ = puVar6 + 1;
      }
      else {
        pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar5 = pVar10.first;
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->transposeb_ = uVar5 != 0;
      goto LAB_0021f4c6;
    }
    break;
  case 5:
    if (cVar8 != '(') break;
    puVar6 = input->buffer_;
    if ((puVar6 < input->buffer_end_) && (-1 < (long)(char)*puVar6)) {
      this->weightmatrixfirstdimension_ = (long)(char)*puVar6;
      goto LAB_0021f69d;
    }
    pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
    this->weightmatrixfirstdimension_ = pVar10.first;
LAB_0021f78c:
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return false;
    }
    goto LAB_0021f4c6;
  case 6:
    if (cVar8 == '0') {
      puVar6 = input->buffer_;
      if ((input->buffer_end_ <= puVar6) || ((long)(char)*puVar6 < 0)) {
        pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->weightmatrixseconddimension_ = pVar10.first;
        goto LAB_0021f78c;
      }
      this->weightmatrixseconddimension_ = (long)(char)*puVar6;
LAB_0021f69d:
      input->buffer_ = puVar6 + 1;
      goto LAB_0021f4c6;
    }
    break;
  case 7:
    if (cVar8 == '8') {
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (uVar5 = (unsigned_long)(char)*puVar6, -1 < (long)uVar5))
      {
        input->buffer_ = puVar6 + 1;
      }
      else {
        pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar5 = pVar10.first;
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->hasbias_ = uVar5 != 0;
      goto LAB_0021f4c6;
    }
    break;
  case 8:
    if (cVar8 != 'B') break;
    this_00 = this->weights_;
    if (this_00 == (WeightParams *)0x0) {
      this_00 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(this_00);
      this->weights_ = this_00;
    }
LAB_0021f5f9:
    puVar6 = input->buffer_;
    if ((puVar6 < input->buffer_end_) && (byte_limit = (int)(char)*puVar6, -1 < byte_limit)) {
      input->buffer_ = puVar6 + 1;
    }
    else {
      byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (byte_limit < 0) {
        return false;
      }
    }
    pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                      (input,byte_limit);
    if ((long)pVar7 < 0) {
      return false;
    }
    bVar3 = WeightParams::MergePartialFromCodedStream(this_00,input);
    if (!bVar3) {
      return false;
    }
    bVar3 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (input,pVar7.first);
    goto LAB_0021f52a;
  case 9:
    if (cVar8 == 'J') {
      this_00 = this->bias_;
      if (this_00 == (WeightParams *)0x0) {
        this_00 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(this_00);
        this->bias_ = this_00;
      }
      goto LAB_0021f5f9;
    }
    break;
  case 10:
    if (cVar8 == 'P') {
      puVar6 = input->buffer_;
      if ((puVar6 < input->buffer_end_) && (uVar5 = (unsigned_long)(char)*puVar6, -1 < (long)uVar5))
      {
        input->buffer_ = puVar6 + 1;
      }
      else {
        pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar5 = pVar10.first;
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->int8dynamicquantize_ = uVar5 != 0;
      goto LAB_0021f4c6;
    }
  }
switchD_0021f547_caseD_3:
  if (uVar4 == 0) {
    return true;
  }
  if ((uVar4 & 7) == 4) {
    return true;
  }
  bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
LAB_0021f52a:
  if (bVar3 == false) {
    return false;
  }
  goto LAB_0021f4c6;
}

Assistant:

bool BatchedMatMulLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BatchedMatMulLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // bool transposeA = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &transposea_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool transposeB = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &transposeb_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 weightMatrixFirstDimension = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &weightmatrixfirstdimension_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 weightMatrixSecondDimension = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &weightmatrixseconddimension_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBias = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams weights = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams bias = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool int8DynamicQuantize = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &int8dynamicquantize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BatchedMatMulLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BatchedMatMulLayerParams)
  return false;
#undef DO_
}